

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Own<capnp::PipelineHook,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PostReturnRpcPipeline::addRef
          (PostReturnRpcPipeline *this)

{
  PipelineHook *extraout_RDX;
  _func_int **in_RSI;
  Own<capnp::PipelineHook,_std::nullptr_t> OVar1;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::PostReturnRpcPipeline,_std::nullptr_t> local_18;
  
  *(int *)(in_RSI + 2) = *(int *)(in_RSI + 2) + 1;
  local_18.disposer = (Disposer *)(in_RSI + 1);
  (this->super_PipelineHook)._vptr_PipelineHook = (_func_int **)local_18.disposer;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = in_RSI;
  local_18.ptr = (PostReturnRpcPipeline *)0x0;
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::PostReturnRpcPipeline,_std::nullptr_t>::
  dispose(&local_18);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<PipelineHook> addRef() override {
      return kj::addRef(*this);
    }